

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O3

int __thiscall
Imf_3_4::TypedAttribute<int>::copy(TypedAttribute<int> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Attribute *this_00;
  TypedAttribute<int> *pTVar1;
  
  this_00 = (Attribute *)operator_new(0x10);
  this_00->_vptr_Attribute = (_func_int **)0x0;
  this_00[1]._vptr_Attribute = (_func_int **)0x0;
  Attribute::Attribute(this_00);
  this_00->_vptr_Attribute = (_func_int **)&PTR__TypedAttribute_001e3660;
  pTVar1 = cast(&this->super_Attribute);
  *(int *)&this_00[1]._vptr_Attribute = pTVar1->_value;
  return (int)this_00;
}

Assistant:

Attribute*
TypedAttribute<T>::copy () const
{
    Attribute* attribute = new TypedAttribute<T> ();
    attribute->copyValueFrom (*this);
    return attribute;
}